

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

void anon_unknown.dwarf_5a2f::SolverDpllTriadSimd<0>::AssertionsToEliminations
               (Cells16 *assertions,int box_i,int box_j,Cells16 *box_eliminations,
               Cells08 *h_band_eliminations,Cells08 *v_band_eliminations)

{
  undefined8 *in_RCX;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  Bitvec16x16 *z;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  Bitvec16x16 *y;
  undefined8 in_YMM0_H;
  undefined8 uVar1;
  undefined8 uVar2;
  Bitvec16x16 *x;
  undefined8 in_register_00001218;
  undefined8 uVar3;
  undefined8 uVar4;
  Cells16 new_eliminations;
  Cells16 hv_pos_triad_assertions;
  Cells16 hv_neg_triad_assertions;
  Cells16 new_box_eliminations;
  Cells16 across_cols;
  Cells16 across_rows;
  Bitvec16x16 cell_assertions_only;
  Cells16 *in_stack_fffffffffffffce0;
  Bitvec16x16 *in_stack_fffffffffffffd00;
  Bitvec16x16 *this;
  Bitvec16x16 *in_stack_fffffffffffffd08;
  Bitvec16x16 *this_00;
  Bitvec16x16 *in_stack_fffffffffffffd10;
  Bitvec16x16 *in_stack_fffffffffffffd18;
  Bitvec16x16 *in_stack_fffffffffffffd20;
  Bitvec08x16 local_280;
  Cells16 *in_stack_fffffffffffffd98;
  Bitvec16x16 local_260;
  Bitvec08x16 local_240;
  Bitvec08x16 local_230;
  Bitvec16x16 local_220;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 *local_48;
  
  local_48 = in_RCX;
  Bitvec16x16::operator&(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  local_80 = extraout_XMM0_Qa;
  uStack_78 = extraout_XMM0_Qb;
  uStack_70 = in_YMM0_H;
  uStack_68 = in_register_00001218;
  Bitvec16x16::RotateRows(in_stack_fffffffffffffd10);
  uVar1 = 0;
  uVar3 = 0;
  Bitvec16x16::operator|=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  Bitvec16x16::RotateRows2(in_stack_fffffffffffffd10);
  uVar2 = 0;
  uVar4 = 0;
  uStack_d0 = uVar1;
  uStack_c8 = uVar3;
  Bitvec16x16::operator|=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  local_100 = local_80;
  local_f8 = uStack_78;
  local_f0 = uStack_70;
  local_e8 = uStack_68;
  Bitvec16x16::RotateCols(in_stack_fffffffffffffd10);
  uVar1 = 0;
  uVar3 = 0;
  uStack_110 = uVar2;
  uStack_108 = uVar4;
  Bitvec16x16::operator|=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  Bitvec16x16::RotateCols2(in_stack_fffffffffffffd10);
  uVar2 = 0;
  uVar4 = 0;
  uStack_130 = uVar1;
  uStack_128 = uVar3;
  Bitvec16x16::operator|=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  Bitvec16x16::Shuffle(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  uStack_170 = uVar2;
  uStack_168 = uVar4;
  Bitvec16x16::Shuffle(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  uStack_190 = uVar2;
  uStack_188 = uVar4;
  Bitvec16x16::X_Y_or_Z_or
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  uStack_150 = uVar2;
  uStack_148 = uVar4;
  Bitvec16x16::WhichNonZero(in_stack_fffffffffffffd10);
  uStack_1d0 = uVar2;
  uStack_1c8 = uVar4;
  Bitvec16x16::X_Y_or_Z_or
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  uStack_1b0 = uVar2;
  uStack_1a8 = uVar4;
  uStack_150 = uVar2;
  uStack_148 = uVar4;
  Bitvec16x16::X_Y_xor_Z_or
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  *local_48 = extraout_XMM0_Qa_00;
  local_48[1] = extraout_XMM0_Qb_00;
  local_48[2] = uVar2;
  local_48[3] = uVar4;
  x = (Bitvec16x16 *)0x0;
  uStack_1f0 = uVar2;
  uStack_1e8 = uVar4;
  HorizontalTriads(in_stack_fffffffffffffd98);
  VerticalTriads(in_stack_fffffffffffffce0);
  Bitvec16x16::Bitvec16x16(&local_220,&local_230,&local_240);
  HorizontalTriads(in_stack_fffffffffffffd98);
  VerticalTriads(in_stack_fffffffffffffce0);
  Bitvec16x16::Bitvec16x16(&local_260,(Bitvec08x16 *)&stack0xfffffffffffffd90,&local_280);
  Bitvec16x16::Shuffle(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Bitvec16x16::Shuffle(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Bitvec16x16::Shuffle(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  this = z;
  this_00 = y;
  Bitvec16x16::X_Y_or_Z_or(x,y,z);
  Bitvec16x16::GetLo(this);
  Bitvec08x16::operator|=((Bitvec08x16 *)this_00,(Bitvec08x16 *)this);
  Bitvec16x16::GetHi(this);
  Bitvec08x16::operator|=((Bitvec08x16 *)this_00,(Bitvec08x16 *)this);
  return;
}

Assistant:

static inline void AssertionsToEliminations(const Cells16 &assertions, int box_i, int box_j,
                                                Cells16 &box_eliminations,
                                                Cells08 &h_band_eliminations,
                                                Cells08 &v_band_eliminations) {
        // we could guard some or all of the code below with checks that the assertion vector as
        // a whole, or cell or negative triad components of it, are nonzero. but the branches
        // would most often be taken. it's cheaper to compute no-op updates than it is to pay the
        // branch cost.

        // update the self eliminations for new assertions in the box.
        auto cell_assertions_only = assertions & tables.cell3x3_mask;
        // compute matrices broadcasting assertions across rows and columns in which they occur.
        Cells16 across_rows = cell_assertions_only;
        across_rows |= across_rows.RotateRows();
        across_rows |= across_rows.RotateRows2();
        Cells16 across_cols = cell_assertions_only;
        across_cols |= across_cols.RotateCols();
        across_cols |= across_cols.RotateCols2();
        // let 3x3 submatrix have assertions occuring anywhere
        Cells16 new_box_eliminations = Cells16::X_Y_or_Z_or(across_cols,
                                                            across_cols.Shuffle(tables.row_rotate_3x3_1),
                                                            across_cols.Shuffle(tables.row_rotate_3x3_2));
        // join 3x3 submatrix, row/col margins, and all elimination bits in asserted cells
        new_box_eliminations = Cells16::X_Y_or_Z_or(
                new_box_eliminations, across_rows, cell_assertions_only.WhichNonZero());
        // then apply after clearing elimination bits for the asserted candidates.
        box_eliminations = Cells16::X_Y_xor_Z_or(
                new_box_eliminations, cell_assertions_only, box_eliminations);

        // below we'll update band eliminations to reflect assertion of negative triads or positive
        // literals within this box. in the case of asserted negative triads we'll eliminate the
        // corresponding positive triads in the band (at shift 0).
        Cells16 hv_neg_triad_assertions{HorizontalTriads(assertions),
                                        VerticalTriads(assertions)};
        // in the case of asserted positive literals, which imply the assertion of corresponding
        // shift 0 positive triads, we'll eliminate the triads at shifts 1 and 2 in the band.
        Cells16 hv_pos_triad_assertions{HorizontalTriads(new_box_eliminations),
                                        VerticalTriads(new_box_eliminations)};
        Cells16 new_eliminations = Cells16::X_Y_or_Z_or(
                hv_neg_triad_assertions.Shuffle(
                        tables.triads_shift0_to_config_elims16[box_j * 3 + box_i]),
                hv_pos_triad_assertions.Shuffle(
                        tables.triads_shift1_to_config_elims16[box_j * 3 + box_i]),
                hv_pos_triad_assertions.Shuffle(
                        tables.triads_shift2_to_config_elims16[box_j * 3 + box_i]));
        h_band_eliminations |= new_eliminations.GetLo();
        v_band_eliminations |= new_eliminations.GetHi();
    }